

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::QuadMeshNode> *mesh,ssize_t id)

{
  MaterialNode *pMVar1;
  QuadMeshNode *pQVar2;
  int __oflag;
  int __oflag_00;
  pointer pvVar3;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  pointer pvVar4;
  allocator local_f1;
  Ref<embree::SceneGraph::MaterialNode> local_f0;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string(local_48,"QuadMesh",&local_f1);
  open(this,(char *)local_48,(int)id);
  std::__cxx11::string::~string(local_48);
  pMVar1 = (mesh->ptr->material).ptr;
  local_f0.ptr = pMVar1;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[2])(pMVar1);
  }
  store(this,&local_f0);
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[3])(pMVar1);
  }
  pvVar4 = (mesh->ptr->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (mesh->ptr->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pvVar3 - (long)pvVar4 != 0x20) {
    std::__cxx11::string::string(local_68,"animated_positions",&local_f1);
    open(this,(char *)local_68,__oflag);
    std::__cxx11::string::~string(local_68);
    pvVar4 = (mesh->ptr->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (mesh->ptr->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pvVar4 != pvVar3; pvVar4 = pvVar4 + 1) {
    store(this,"positions",pvVar4);
  }
  pQVar2 = mesh->ptr;
  if ((long)(pQVar2->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pQVar2->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    std::__cxx11::string::string(local_88,"animated_positions",&local_f1);
    close(this,(int)local_88);
    std::__cxx11::string::~string(local_88);
    pQVar2 = mesh->ptr;
    if ((long)(pQVar2->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pQVar2->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      std::__cxx11::string::string(local_a8,"animated_normals",&local_f1);
      open(this,(char *)local_a8,__oflag_00);
      std::__cxx11::string::~string(local_a8);
      pQVar2 = mesh->ptr;
    }
  }
  pvVar3 = (pQVar2->normals).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar4 = (pQVar2->normals).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar3; pvVar4 = pvVar4 + 1) {
    store(this,"normals",pvVar4);
  }
  pQVar2 = mesh->ptr;
  if ((long)(pQVar2->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pQVar2->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    std::__cxx11::string::string(local_c8,"animated_normals",&local_f1);
    close(this,(int)local_c8);
    std::__cxx11::string::~string(local_c8);
    pQVar2 = mesh->ptr;
  }
  store<embree::Vec2<float>>(this,"texcoords",&pQVar2->texcoords);
  store<embree::SceneGraph::QuadMeshNode::Quad>(this,"indices",&mesh->ptr->quads);
  std::__cxx11::string::string(local_e8,"QuadMesh",&local_f1);
  close(this,(int)local_e8);
  std::__cxx11::string::~string(local_e8);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::QuadMeshNode> mesh, ssize_t id) 
  {
    open("QuadMesh",id);
    store(mesh->material);
    
    if (mesh->numTimeSteps() != 1) open("animated_positions");
    for (const auto& p : mesh->positions) store("positions",p);
    if (mesh->numTimeSteps() != 1) close("animated_positions");

    if (mesh->numTimeSteps() != 1) open("animated_normals");
    for (const auto& p : mesh->normals) store("normals",p);
    if (mesh->numTimeSteps() != 1) close("animated_normals");
    
    store("texcoords",mesh->texcoords);
    store("indices",mesh->quads);
    close("QuadMesh");
  }